

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringReader.hpp
# Opt level: O1

void __thiscall StringReader::~StringReader(StringReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Readable)._vptr_Readable = (_func_int **)&PTR__StringReader_00130598;
  pcVar2 = (this->file)._M_dataplus._M_p;
  paVar1 = &(this->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

~StringReader() override = default;